

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2019::DataTransform<sptk::uint24_t,_int>::Run
          (DataTransform<sptk::uint24_t,_int> *this,istream *input_stream)

{
  uint uVar1;
  NumericType NVar2;
  WarningType WVar3;
  uint uVar4;
  ostream *poVar5;
  uint uVar6;
  size_t *__idx;
  int iVar7;
  bool bVar8;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  uint24_t input_data;
  allocator local_25d;
  int local_25c;
  string *local_258;
  string local_250;
  string word;
  char buffer [128];
  
  local_258 = &this->print_format_;
  iVar7 = 0;
  do {
    input_data.value[0] = '\0';
    input_data.value[1] = '\0';
    input_data.value[2] = '\0';
    if (this->is_ascii_input_ == true) {
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      std::operator>>(input_stream,(string *)&word);
      bVar8 = word._M_string_length == 0;
      if (!bVar8) {
        std::__cxx11::stold((longdouble *)&word,(string *)0x0,__idx);
        local_25c = (int)ROUND(in_ST0);
        input_data.value = SUB43(local_25c,0);
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      std::__cxx11::string::~string((string *)&word);
      if (!bVar8) goto LAB_0012678e;
      if (bVar8) {
        if (!bVar8) {
          return false;
        }
        goto LAB_0012695e;
      }
    }
    else {
      bVar8 = sptk::ReadStream<sptk::uint24_t>(&input_data,input_stream);
      if (!bVar8) {
LAB_0012695e:
        if (this->is_ascii_output_ != true) {
          return true;
        }
        if (iVar7 % this->num_column_ != 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          return true;
        }
        return true;
      }
LAB_0012678e:
      uVar4 = (uint)(uint3)input_data.value;
      uVar6 = this->minimum_value_;
      uVar1 = this->maximum_value_;
      if ((int)uVar6 < (int)uVar1) {
        NVar2 = this->input_numeric_type_;
        if (NVar2 == kFloatingPoint) {
          if (((int)uVar6 <= (int)uVar4) && (uVar6 = uVar1, (int)uVar4 <= (int)uVar1))
          goto LAB_001267fa;
        }
        else if (NVar2 == kUnsignedInteger) {
          if (uVar6 <= uVar4) {
            bVar8 = uVar1 < uVar4;
            uVar6 = uVar1;
            if (!bVar8) {
              uVar6 = uVar4;
            }
            goto LAB_001267ff;
          }
        }
        else {
          if (NVar2 != kSignedInteger) goto LAB_001267fa;
          if ((int)uVar6 <= (int)uVar4) {
            bVar8 = (int)uVar1 < (int)uVar4;
            uVar6 = uVar1;
            if ((int)uVar4 <= (int)uVar1) {
              uVar6 = uVar4;
            }
            goto LAB_001267ff;
          }
        }
LAB_00126846:
        if (this->warning_type_ != kIgnore) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&word);
          poVar5 = (ostream *)std::ostream::operator<<((ostream *)&word,iVar7);
          std::operator<<(poVar5,"th data is over the range of output type");
          std::__cxx11::string::string((string *)&local_250,"x2x",&local_25d);
          sptk::PrintErrorMessage(&local_250,(ostringstream *)&word);
          std::__cxx11::string::~string((string *)&local_250);
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&word);
          if (WVar3 == kExit) {
            return false;
          }
        }
      }
      else {
LAB_001267fa:
        bVar8 = false;
        uVar6 = uVar4;
LAB_001267ff:
        if ((bVar8) || (this->rounding_ == false)) {
          if (bVar8) goto LAB_00126846;
        }
        else if (input_data.value == (uint8_t  [3])0x0) {
          uVar6 = 0;
        }
        else {
          uVar6 = (uint)((double)uVar4 + 0.5);
          uVar6 = uVar6 & 0xff | (uVar6 >> 8 & 0xff00 | uVar6 >> 8 & 0xff) << 8;
        }
      }
      if (this->is_ascii_output_ == true) {
        bVar8 = sptk::SnPrintf<int>(uVar6,local_258,0x80,buffer);
        if (!bVar8) {
          return false;
        }
        std::operator<<((ostream *)&std::cout,buffer);
        if ((iVar7 + 1) % this->num_column_ == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        else {
          std::operator<<((ostream *)&std::cout,"\t");
        }
      }
      else {
        bVar8 = sptk::WriteStream<int>(uVar6,(ostream *)&std::cout);
        if (!bVar8) {
          return false;
        }
      }
    }
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }